

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O3

QRectF * __thiscall
QGraphicsSceneBspTree::rectForIndex
          (QRectF *__return_storage_ptr__,QGraphicsSceneBspTree *this,int index)

{
  double dVar1;
  Node *pNVar2;
  uint index_00;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal diff;
  
  if (index < 1) {
    qVar3 = (this->rect).xp;
    qVar4 = (this->rect).yp;
    qVar5 = (this->rect).h;
    __return_storage_ptr__->w = (this->rect).w;
    __return_storage_ptr__->h = qVar5;
    __return_storage_ptr__->xp = qVar3;
    __return_storage_ptr__->yp = qVar4;
  }
  else {
    index_00 = index + -2 >> 1;
    if ((index & 1U) != 0) {
      index_00 = index - 1U >> 1;
    }
    *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
    rectForIndex(__return_storage_ptr__,this,index_00);
    pNVar2 = (this->nodes).d.ptr;
    dVar1 = pNVar2[(int)index_00].field_0.offset;
    if (pNVar2[(int)index_00].type == Vertical) {
      dVar1 = dVar1 - __return_storage_ptr__->xp;
      if ((index & 1U) == 0) {
        __return_storage_ptr__->xp = __return_storage_ptr__->xp + dVar1;
        __return_storage_ptr__->w = __return_storage_ptr__->w - dVar1;
      }
      else {
        __return_storage_ptr__->w = dVar1;
      }
    }
    else {
      dVar1 = dVar1 - __return_storage_ptr__->yp;
      if ((index & 1U) == 0) {
        __return_storage_ptr__->yp = __return_storage_ptr__->yp + dVar1;
        __return_storage_ptr__->h = __return_storage_ptr__->h - dVar1;
      }
      else {
        __return_storage_ptr__->h = dVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsSceneBspTree::rectForIndex(int index) const
{
    if (index <= 0)
        return rect;

    int parentIdx = parentIndex(index);
    QRectF rect = rectForIndex(parentIdx);
    const Node *parent = &nodes.at(parentIdx);

    if (parent->type == Node::Vertical) {
        if (index & 1)
            rect.setRight(parent->offset);
        else
            rect.setLeft(parent->offset);
    } else {
        if (index & 1)
            rect.setBottom(parent->offset);
        else
            rect.setTop(parent->offset);
    }

    return rect;
}